

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O3

int Gia_ManArePrintUsed_rec(Gia_ManAre_t *p,Gia_PtrAre_t Root,int fTree)

{
  Gia_PtrAre_t GVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint **ppuVar5;
  uint uVar6;
  Gia_StaAre_t *pGVar7;
  int iVar8;
  ulong uVar9;
  Gia_StaAre_t *pSta;
  
  if (fTree == 0) {
    iVar8 = 1;
  }
  else {
    iVar8 = 0;
    do {
      lVar2 = *(long *)((long)p->ppObjs + (ulong)((uint)Root >> 0x11 & 0x3ff8));
      uVar9 = (ulong)(((uint)Root & 0xfffff) << 2);
      GVar1 = *(Gia_PtrAre_t *)(lVar2 + 4 + uVar9 * 4);
      uVar6 = 0;
      if (((*(ushort *)(lVar2 + 1 + uVar9 * 4) & 0xfc0) == 0) &&
         (uVar6 = 1, ((uint)GVar1 & 0x7ff00000) == 0)) {
        uVar6 = (uint)(((uint)GVar1 & 0xfffff) != 0);
      }
      iVar3 = Gia_ManArePrintUsed_rec(p,GVar1,uVar6);
      uVar6 = 0;
      GVar1 = *(Gia_PtrAre_t *)(lVar2 + 8 + uVar9 * 4);
      if (((*(ushort *)(lVar2 + 2 + uVar9 * 4) & 0x3f0) == 0) &&
         (uVar6 = 1, ((uint)GVar1 & 0x7ff00000) == 0)) {
        uVar6 = (uint)(((uint)GVar1 & 0xfffff) != 0);
      }
      iVar4 = Gia_ManArePrintUsed_rec(p,GVar1,uVar6);
      Root = *(Gia_PtrAre_t *)(lVar2 + 0xc + uVar9 * 4);
      if (0x3ffffff < *(uint *)(lVar2 + uVar9 * 4)) {
        iVar8 = iVar3 + iVar8 + iVar4;
        break;
      }
      iVar8 = iVar3 + iVar8 + iVar4;
    } while ((((uint)Root & 0x7ff00000) != 0) || (((uint)Root & 0xfffff) != 0));
    iVar8 = iVar8 + 1;
  }
  ppuVar5 = p->ppStas;
  iVar3 = p->nSize;
  pGVar7 = (Gia_StaAre_t *)*ppuVar5;
  for (pSta = (Gia_StaAre_t *)
              ((long)(int)(((uint)Root & 0xfffff) * iVar3) * 4 +
              *(long *)((long)ppuVar5 + (ulong)((uint)Root >> 0x11 & 0x3ff8))); pGVar7 != pSta;
      pSta = (Gia_StaAre_t *)
             ((long)(int)(((uint)pSta->iNext & 0xfffff) * iVar3) * 4 +
             *(long *)((long)ppuVar5 + (ulong)((uint)pSta->iNext >> 0x11 & 0x3ff8)))) {
    if (-1 < (int)pSta->iPrev) {
      Gia_ManArePrintCube(p,pSta);
      ppuVar5 = p->ppStas;
      iVar3 = p->nSize;
      pGVar7 = (Gia_StaAre_t *)*ppuVar5;
    }
  }
  return iVar8;
}

Assistant:

int Gia_ManArePrintUsed_rec( Gia_ManAre_t * p, Gia_PtrAre_t Root, int fTree )
{
    Gia_ObjAre_t * pObj;
    if ( !fTree )
        return Gia_ManArePrintListUsed( p, Root );
    pObj = Gia_ManAreObj(p, Root);
    return Gia_ManArePrintUsed_rec( p, pObj->F[0], Gia_ObjHasBranch0(pObj) ) +
           Gia_ManArePrintUsed_rec( p, pObj->F[1], Gia_ObjHasBranch1(pObj) ) +
           Gia_ManArePrintUsed_rec( p, pObj->F[2], Gia_ObjHasBranch2(pObj) );
}